

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

void __thiscall
IfNeuron::IfNeuron(IfNeuron *this,Time *time,double v_0,double theta,double spikeheight,double tau,
                  double v_rest,string *name,string *type)

{
  StochasticEventGenerator *this_00;
  Time *time_00;
  VoltageDependance *this_01;
  StochasticVariable *integrator;
  allocator<char> local_2f4;
  allocator<char> local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  Unit local_2f0;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  string local_260;
  string local_240;
  Unit local_220;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8 [32];
  string local_d8;
  string local_b8;
  Unit local_98;
  
  local_288 = tau;
  local_280 = v_rest;
  local_278 = spikeheight;
  local_270 = theta;
  local_268 = v_0;
  std::__cxx11::string::string((string *)&local_b8,(string *)name);
  std::__cxx11::string::string((string *)&local_d8,(string *)type);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron = (_func_int **)&PTR_addStimulus_00155118;
  this_00 = &(this->super_SpikingNeuron).super_StochasticEventGenerator;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric = (_func_int **)&PTR__IfNeuron_00155180;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__IfNeuron_00155218;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__IfNeuron_00155260;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"V",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Differential Equation",(allocator<char> *)&local_240);
  DifferentialEquation::DifferentialEquation
            (&this->ifneuronMembrane,time,local_268,0.0,(string *)&local_2f0,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"threshold",(allocator<char> *)&local_220);
  Parametric::addParameter((Parametric *)this_00,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"spike-height",(allocator<char> *)&local_220);
  Parametric::addParameter((Parametric *)this_00,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"membrane",(allocator<char> *)&local_220);
  Parametric::addParameter((Parametric *)this_00,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::assign
            ((char *)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                      super_StochasticVariable.super_StochasticProcess.super_Physical.
                      physicalDescription);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"LIF neuron membrane",(allocator<char> *)&local_2f0);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.
              stochDescription);
  std::__cxx11::string::~string(local_f8);
  this->ifneuronSpikeHeight = local_278;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventCurrentValue = false;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
  this->ifneuronTheta = local_270;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"m",(allocator<char> *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"V",(allocator<char> *)&local_240);
  Unit::Unit(&local_2f0,&local_118,&local_138);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"u",&local_2f3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"F",&local_2f4);
  Unit::Unit(&local_220,&local_158,&local_178);
  operator*(&local_98,&local_2f0,&local_220);
  Physical::setUnit(&(this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                     super_Physical,&local_98);
  Unit::~Unit(&local_98);
  Unit::~Unit(&local_220);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  Unit::~Unit(&local_2f0);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"m",(allocator<char> *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"V",(allocator<char> *)&local_260);
  Unit::Unit(&local_2f0,&local_198,&local_1b8);
  Unit::operator=(&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                   super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit,
                  &local_2f0);
  Unit::~Unit(&local_2f0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  this_01 = (VoltageDependance *)operator_new(0x160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"leak",&local_2f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Weighted Difference",&local_2f4);
  VoltageDependance::VoltageDependance
            (this_01,1.0 / local_288,local_280,(string *)&local_2f0,(string *)&local_220);
  integrator = (StochasticVariable *)operator_new(0x148);
  time_00 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
            super_StochasticProcess.super_TimeDependent.xTime;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"t",&local_2f1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"Time Process",&local_2f2)
  ;
  TimeProcess::TimeProcess((TimeProcess *)integrator,time_00,&local_260,&local_240);
  DifferentialEquation::addTerm(&this->ifneuronMembrane,(StochasticFunction *)this_01,integrator);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_2f0);
  return;
}

Assistant:

IfNeuron::IfNeuron(Time *time, double v_0, double theta, double spikeheight, double tau, double v_rest, const string& name, const string& type)
	: SpikingNeuron(time, name, type), ifneuronMembrane(time, v_0, 0.0, "V")
{
	// parameter accessors
	addParameter("threshold");
	addParameter("spike-height");
	addParameter("membrane");
	
	// write descriptions
	physicalDescription = "voltage";
	ifneuronMembrane.setDescription("LIF neuron membrane");
	
	// assign values
	ifneuronSpikeHeight = spikeheight;
	eventCurrentValue = false;
	eventNextValue = false;
	ifneuronTheta = theta;	
	ifneuronMembrane.setUnit( Unit("m","V") * Unit("u","F") );
	physicalUnit = Unit("m","V");
	
	// add decay terms
	ifneuronMembrane.addTerm( new VoltageDependance(1.0/tau, v_rest, "leak"), new TimeProcess(xTime) );
}